

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe.h
# Opt level: O0

size_type __thiscall
lf::uscalfe::FeLagrangeO3Quad<double>::NumRefShapeFunctions
          (FeLagrangeO3Quad<double> *this,dim_t codim)

{
  ostream *this_00;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [380];
  dim_t local_1c;
  FeLagrangeO3Quad<double> *pFStack_18;
  dim_t codim_local;
  FeLagrangeO3Quad<double> *this_local;
  
  if (codim == 0) {
    this_local._4_4_ = 4;
  }
  else if (codim == 1) {
    this_local._4_4_ = 2;
  }
  else {
    if (codim != 2) {
      local_1c = codim;
      pFStack_18 = this;
      std::__cxx11::stringstream::stringstream(local_1a8);
      this_00 = std::operator<<(local_198,"Illegal codim");
      std::ostream::operator<<(this_00,local_1c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"false",&local_1d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
                 ,&local_201);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_1d8,&local_200,0x520,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_200);
      std::allocator<char>::~allocator(&local_201);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator(&local_1d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"false",&local_249);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
                 ,&local_271);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"",&local_299);
      lf::base::AssertionFailed(&local_248,&local_270,0x520,&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      std::allocator<char>::~allocator(&local_299);
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator(&local_271);
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator(&local_249);
      abort();
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

[[nodiscard]] size_type NumRefShapeFunctions(dim_t codim) const override {
    switch (codim) {
      case 0:
        return 4;
      case 1:
        return 2;
      case 2:
        return 1;
      default:
        LF_ASSERT_MSG(false, "Illegal codim" << codim);
    }
    return 0;
  }